

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_paint(Terminal *term,wchar_t left,wchar_t top,wchar_t right,wchar_t bottom,
               _Bool immediately)

{
  ulong *puVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  termline *ptVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  wchar_t wVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar10 = 0;
  uVar8 = (ulong)(uint)left;
  if (left < L'\x01') {
    uVar8 = uVar10;
  }
  if (L'\0' < top) {
    uVar10 = (ulong)(uint)top;
  }
  wVar2 = term->cols;
  wVar9 = wVar2 + L'\xffffffff';
  if (right < wVar2) {
    wVar9 = right;
  }
  wVar3 = term->rows;
  wVar5 = wVar3 + L'\xffffffff';
  if (bottom < wVar3) {
    wVar5 = bottom;
  }
  for (; ((long)uVar10 <= (long)wVar5 && ((long)uVar10 < (long)wVar3)); uVar10 = uVar10 + 1) {
    ptVar4 = term->disptext[uVar10];
    uVar7 = uVar8;
    uVar6 = uVar8 >> 1;
    uVar12 = uVar8 << 5 | 8;
    uVar11 = (uVar8 >> 1) << 5 | 8;
    if ((ptVar4->lattr & 3) == 0) {
      for (; ((long)uVar7 <= (long)wVar9 && ((long)uVar7 < (long)wVar2)); uVar7 = uVar7 + 1) {
        puVar1 = (ulong *)((long)&ptVar4->chars->chr + uVar12);
        *puVar1 = *puVar1 | 0x3ffff;
        uVar12 = uVar12 + 0x20;
      }
    }
    else {
      for (; ((long)uVar6 <= (long)(wVar9 / 2 + 1) && ((long)uVar6 < (long)wVar2));
          uVar6 = uVar6 + 1) {
        puVar1 = (ulong *)((long)&ptVar4->chars->chr + uVar11);
        *puVar1 = *puVar1 | 0x3ffff;
        uVar11 = uVar11 + 0x20;
      }
    }
  }
  if (!immediately) {
    term_schedule_update(term);
    return;
  }
  do_paint(term);
  return;
}

Assistant:

void term_paint(Terminal *term,
                int left, int top, int right, int bottom, bool immediately)
{
    int i, j;
    if (left < 0) left = 0;
    if (top < 0) top = 0;
    if (right >= term->cols) right = term->cols-1;
    if (bottom >= term->rows) bottom = term->rows-1;

    for (i = top; i <= bottom && i < term->rows; i++) {
        if ((term->disptext[i]->lattr & LATTR_MODE) == LATTR_NORM)
            for (j = left; j <= right && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        else
            for (j = left / 2; j <= right / 2 + 1 && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
    }

    if (immediately) {
        do_paint(term);
    } else {
        term_schedule_update(term);
    }
}